

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     ReentrantPush<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
     ::consume(consume_operation *i_consume)

{
  bool bVar1;
  runtime_type<> *this;
  uint *puVar2;
  consume_operation *i_consume_local;
  
  this = density::
         conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         consume_operation::complete_type((consume_operation *)i_consume);
  bVar1 = density::runtime_type<>::is<unsigned_int>(this);
  if (!bVar1) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x1c6);
  }
  puVar2 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           consume_operation::element<unsigned_int>((consume_operation *)i_consume);
  if (*puVar2 != 0x20) {
    assert_failed<>("i_consume.template element<ElementType>() == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x1c7);
  }
  return;
}

Assistant:

static void consume(const typename QUEUE::consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                DENSITY_TEST_ASSERT(i_consume.template element<ElementType>() == 32);
            }